

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O0

QColor * QItemDelegate::selectedPixmap(QPixmap *pixmap,QPalette *palette,bool enabled)

{
  byte bVar1;
  ImageConversionFlag flags;
  int iVar2;
  int iVar3;
  ulong uVar4;
  QColor *pQVar5;
  long lVar6;
  byte in_CL;
  QPainter *in_RDX;
  QColor *in_RDI;
  long in_FS_OFFSET;
  int n;
  QPixmap *pm;
  QPainter painter;
  QImage img;
  QString key;
  QColor color;
  ColorRole in_stack_ffffffffffffff38;
  ColorGroup in_stack_ffffffffffffff3c;
  QColor *this;
  int in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 uVar7;
  QFlagsStorage<Qt::ImageConversionFlag> flags_00;
  QPixmap local_88 [24];
  undefined1 *local_70 [2];
  QImage local_60 [24];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_CL & 1;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  pQVar5 = in_RDI;
  QPixmap::cacheKey();
  flags_00.i = (Int)((ulong)pQVar5 >> 0x20);
  qPixmapSerial(CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff56,
                                        CONCAT24(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50
                                                ))),SUB81((ulong)this >> 0x38,0));
  uVar7 = 0;
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&this->ct + 4) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(this + 1) = &DAT_aaaaaaaaaaaaaaaa;
  QPixmap::QPixmap((QPixmap *)this);
  uVar4 = QPixmapCache::find((QString *)&local_30,(QPixmap *)this);
  if ((uVar4 & 1) == 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::toImage();
    QFlags<Qt::ImageConversionFlag>::QFlags
              ((QFlags<Qt::ImageConversionFlag> *)in_RDI,in_stack_ffffffffffffff3c);
    QImage::convertToFormat
              ((QImage *)
               CONCAT17(bVar1,CONCAT16(uVar7,CONCAT24(in_stack_ffffffffffffff54,
                                                      in_stack_ffffffffffffff50))),
               (Format)((ulong)this >> 0x20),(ImageConversionFlags)flags_00.i);
    QImage::~QImage(local_60);
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    pQVar5 = QPalette::color((QPalette *)in_RDI,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
    ;
    local_18 = *(undefined1 **)pQVar5;
    local_10 = *(undefined1 **)((long)&pQVar5->ct + 4);
    QColor::setAlphaF(0.3);
    local_70[0] = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)local_70,(QPaintDevice *)&local_48);
    QPainter::setCompositionMode((CompositionMode)local_70);
    flags = QImage::width();
    QImage::height();
    QPainter::fillRect(in_RDX,CONCAT13(bVar1,CONCAT12(uVar7,in_stack_ffffffffffffff54)),
                       in_stack_ffffffffffffff50,(int)((ulong)this >> 0x20),(int)this,in_RDI);
    QPainter::end();
    QFlags<Qt::ImageConversionFlag>::QFlags((QFlags<Qt::ImageConversionFlag> *)in_RDI,flags);
    QPixmap::fromImage((QImage *)local_88,(QFlags_conflict1 *)&local_48);
    QPixmap::operator=((QPixmap *)this,(QPixmap *)in_RDI);
    QPixmap::~QPixmap(local_88);
    lVar6 = QImage::sizeInBytes();
    iVar2 = (int)(lVar6 >> 10) + 1;
    iVar3 = QPixmapCache::cacheLimit();
    if (iVar3 < iVar2) {
      QPixmapCache::setCacheLimit(iVar2);
    }
    QPixmapCache::insert((QString *)&local_30,(QPixmap *)this);
    QPainter::~QPainter((QPainter *)local_70);
    QImage::~QImage((QImage *)&local_48);
  }
  QString::~QString((QString *)0x855756);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QPixmap QItemDelegate::selectedPixmap(const QPixmap &pixmap, const QPalette &palette, bool enabled)
{
    const QString key = qPixmapSerial(pixmap.cacheKey(), enabled);
    QPixmap pm;
    if (!QPixmapCache::find(key, &pm)) {
        QImage img = pixmap.toImage().convertToFormat(QImage::Format_ARGB32_Premultiplied);

        QColor color = palette.color(enabled ? QPalette::Normal : QPalette::Disabled,
                                     QPalette::Highlight);
        color.setAlphaF(0.3f);

        QPainter painter(&img);
        painter.setCompositionMode(QPainter::CompositionMode_SourceAtop);
        painter.fillRect(0, 0, img.width(), img.height(), color);
        painter.end();

        pm = QPixmap(QPixmap::fromImage(img));
        const int n = (img.sizeInBytes() >> 10) + 1;
        if (QPixmapCache::cacheLimit() < n)
            QPixmapCache::setCacheLimit(n);

        QPixmapCache::insert(key, pm);
    }
    return pm;
}